

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_UInt16 addNamespace(UA_Server *server,UA_String name)

{
  ulong uVar1;
  int iVar2;
  UA_StatusCode UVar3;
  ulong uVar4;
  UA_String *pUVar5;
  size_t __n;
  size_t sVar6;
  bool bVar7;
  size_t local_50;
  UA_String name_local;
  
  name_local.length = (size_t)name.data;
  __n = name.length;
  uVar1 = server->namespacesSize;
  bVar7 = uVar1 != 0;
  local_50 = __n;
  name_local.data = (UA_Byte *)name_local.length;
  if (bVar7) {
    pUVar5 = server->namespaces;
    uVar4 = 0;
    sVar6 = 0;
    do {
      if ((pUVar5[uVar4].length == __n) &&
         (iVar2 = bcmp(name_local.data,pUVar5[uVar4].data,__n), iVar2 == 0)) {
        if (bVar7) goto LAB_0011530e;
        break;
      }
      sVar6 = (size_t)((int)sVar6 + 1);
      uVar4 = sVar6 & 0xffff;
      bVar7 = uVar4 < uVar1;
    } while (uVar4 < uVar1);
  }
  pUVar5 = (UA_String *)realloc(server->namespaces,uVar1 * 0x10 + 0x10);
  if (pUVar5 != (UA_String *)0x0) {
    server->namespaces = pUVar5;
    UVar3 = UA_copy(&local_50,pUVar5 + server->namespacesSize,UA_TYPES + 0xb);
    if (UVar3 == 0) {
      sVar6 = server->namespacesSize;
      server->namespacesSize = sVar6 + 1;
      goto LAB_0011530e;
    }
  }
  sVar6 = 0;
LAB_0011530e:
  return (UA_UInt16)sVar6;
}

Assistant:

UA_UInt16 addNamespace(UA_Server *server, const UA_String name) {
    /* Check if the namespace already exists in the server's namespace array */
    for(UA_UInt16 i=0;i<server->namespacesSize;++i) {
        if(UA_String_equal(&name, &server->namespaces[i]))
            return i;
    }

    /* Add a new namespace to the namsepace array */
    UA_String *newNS = UA_realloc(server->namespaces,
                                  sizeof(UA_String) * (server->namespacesSize + 1));
    if(!newNS)
        return 0;
    server->namespaces = newNS;
    UA_StatusCode retval = UA_String_copy(&name, &server->namespaces[server->namespacesSize]);
    if(retval != UA_STATUSCODE_GOOD)
        return 0;
    ++server->namespacesSize;
    return (UA_UInt16)(server->namespacesSize - 1);
}